

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_cursor.c
# Opt level: O3

_Bool ts_tree_cursor_child_iterator_next
                (CursorChildIterator *self,TreeCursorEntry *result,_Bool *visible)

{
  Subtree *pSVar1;
  uint32_t uVar2;
  undefined4 uVar3;
  uint uVar4;
  undefined4 uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  SubtreeHeapData *pSVar10;
  ulong uVar11;
  int iVar12;
  uint32_t uVar13;
  int iVar15;
  ulong uVar14;
  undefined4 uStack_2c;
  Length result_1;
  
  pSVar10 = (self->parent).ptr;
  if (pSVar10 != (SubtreeHeapData *)0x0) {
    uVar4 = self->child_index;
    if (uVar4 != pSVar10->child_count) {
      pSVar1 = (pSVar10->field_17).field_0.children + uVar4;
      uVar13 = (self->position).extent.column;
      uVar8 = (self->position).bytes;
      uVar9 = (self->position).extent.row;
      uVar2 = self->structural_child_index;
      result->subtree = pSVar1;
      (result->position).extent.column = uVar13;
      (result->position).bytes = uVar8;
      (result->position).extent.row = uVar9;
      result->child_index = uVar4;
      result->structural_child_index = uVar2;
      pSVar10 = pSVar1->ptr;
      if (((ulong)pSVar10 & 1) == 0) {
        uVar4 = (uint)*(ushort *)&pSVar10->field_0x2c;
      }
      else {
        uVar4 = (uint)((ulong)pSVar10 >> 1) & 0x7fffffff;
      }
      *visible = SUB41(uVar4 & 1,0);
      pSVar10 = pSVar1->ptr;
      if (((ulong)pSVar10 & 1) == 0) {
        uVar6 = *(uint *)&pSVar10->field_0x2c >> 2;
      }
      else {
        uVar6 = (uint)((ulong)pSVar10 >> 3) & 0x1fffffff;
      }
      if (((uVar6 & 1) == 0) && (self->alias_sequence != (TSSymbol *)0x0)) {
        *visible = (short)(uVar4 & 1) != 0 ||
                   self->alias_sequence[self->structural_child_index] != 0;
        pSVar10 = pSVar1->ptr;
      }
      if (((ulong)pSVar10 & 1) == 0) {
        uVar11._0_4_ = (pSVar10->size).bytes;
        uVar11._4_4_ = (pSVar10->size).extent.row;
        uVar4 = (pSVar10->size).extent.column;
        iVar15 = uVar11._4_4_;
      }
      else {
        uVar11 = (ulong)pSVar10 >> 0x18 & 0xff;
        uVar4 = (uint)uVar11;
        iVar15 = 0;
      }
      uVar3 = (self->position).bytes;
      uVar5 = (self->position).extent.row;
      iVar12 = uVar3 + (int)uVar11;
      uVar14 = CONCAT44((self->position).extent.column,uVar5) + CONCAT44(uVar4,iVar15);
      uVar11 = uVar14 & 0xffffffff | (ulong)uVar4 << 0x20;
      if (iVar15 == 0) {
        uVar11 = uVar14;
      }
      result_1.extent.row = (uint32_t)uVar11;
      (self->position).bytes = iVar12;
      (self->position).extent.row = result_1.extent.row;
      (self->position).extent.column = (uint32_t)(uVar11 >> 0x20);
      uVar4 = self->child_index + 1;
      self->child_index = uVar4;
      if ((uVar6 & 1) == 0) {
        self->structural_child_index = self->structural_child_index + 1;
      }
      if (((self->parent).ptr)->child_count <= uVar4) {
        return true;
      }
      pSVar10 = (((self->parent).ptr)->field_17).field_0.children[uVar4].ptr;
      if (((ulong)pSVar10 & 1) == 0) {
        uVar4 = (pSVar10->padding).bytes;
        uVar6 = (pSVar10->padding).extent.row;
        uVar13 = (pSVar10->padding).extent.column;
      }
      else {
        uVar4 = (uint)((ulong)pSVar10 >> 0x10) & 0xff;
        uVar7 = (uint)((ulong)pSVar10 >> 0x20);
        uVar6 = uVar7 >> 8 & 0xf;
        uVar13 = uVar7 & 0xff;
      }
      uVar11 = uVar11 + CONCAT44(uVar13,uVar6);
      uVar14 = uVar11 & 0xffffffff | (ulong)uVar13 << 0x20;
      if (uVar6 == 0) {
        uVar14 = uVar11;
      }
      result_1.extent.row = (uint32_t)uVar14;
      (self->position).bytes = uVar4 + iVar12;
      (self->position).extent.row = result_1.extent.row;
      (self->position).extent.column = (uint32_t)(uVar14 >> 0x20);
      return true;
    }
  }
  return false;
}

Assistant:

static inline bool ts_tree_cursor_child_iterator_next(CursorChildIterator *self,
                                                      TreeCursorEntry *result,
                                                      bool *visible) {
  if (!self->parent.ptr || self->child_index == self->parent.ptr->child_count) return false;
  const Subtree *child = &self->parent.ptr->children[self->child_index];
  *result = (TreeCursorEntry) {
    .subtree = child,
    .position = self->position,
    .child_index = self->child_index,
    .structural_child_index = self->structural_child_index,
  };
  *visible = ts_subtree_visible(*child);
  bool extra = ts_subtree_extra(*child);
  if (!extra && self->alias_sequence) {
    *visible |= self->alias_sequence[self->structural_child_index];
  }

  self->position = length_add(self->position, ts_subtree_size(*child));
  self->child_index++;
  if (!extra) self->structural_child_index++;

  if (self->child_index < self->parent.ptr->child_count) {
    Subtree next_child = self->parent.ptr->children[self->child_index];
    self->position = length_add(self->position, ts_subtree_padding(next_child));
  }

  return true;
}